

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O2

string * testing::internal::CanonicalizeForStdLibVersioning
                   (string *__return_storage_ptr__,string *s)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  iVar1 = std::__cxx11::string::compare((ulong)s,0,(char *)0x7);
  if ((iVar1 == 0) && (lVar2 = std::__cxx11::string::find((char *)s,0x166027), lVar2 != -1)) {
    std::__cxx11::string::erase((ulong)s,3);
  }
  while (uVar3 = std::__cxx11::string::find((char *)s,0x1683a5), uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)s,uVar3,(char *)0x2);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

inline std::string CanonicalizeForStdLibVersioning(std::string s) {
  static const char prefix[] = "std::__";
  if (s.compare(0, strlen(prefix), prefix) == 0) {
    std::string::size_type end = s.find("::", strlen(prefix));
    if (end != s.npos) {
      // Erase everything between the initial `std` and the second `::`.
      s.erase(strlen("std"), end - strlen("std"));
    }
  }

  // Strip redundant spaces in typename to match MSVC
  // For example, std::pair<int, bool> -> std::pair<int,bool>
  static const char to_search[] = ", ";
  static const char replace_str[] = ",";
  size_t pos = 0;
  while (true) {
    // Get the next occurrence from the current position
    pos = s.find(to_search, pos);
    if (pos == std::string::npos) {
      break;
    }
    // Replace this occurrence of substring
    s.replace(pos, strlen(to_search), replace_str);
    pos += strlen(replace_str);
  }
  return s;
}